

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O0

int mov_mem_mem(em8051 *aCPU)

{
  uint uVar1;
  int iVar2;
  int value;
  int address1;
  em8051 *aCPU_local;
  
  uVar1 = (uint)aCPU->mCodeMem[(int)(aCPU->mPC + 2U & aCPU->mCodeMemSize - 1U)];
  iVar2 = read_mem(aCPU,(uint)aCPU->mCodeMem[(int)(aCPU->mPC + 1U & aCPU->mCodeMemSize - 1U)]);
  if (uVar1 < 0x80) {
    aCPU->mLowerData[(int)uVar1] = (uchar)iVar2;
  }
  else {
    aCPU->mSFR[(int)(uVar1 - 0x80)] = (uchar)iVar2;
    if (aCPU->sfrwrite != (em8051sfrwrite)0x0) {
      (*aCPU->sfrwrite)(aCPU,uVar1);
    }
  }
  aCPU->mPC = aCPU->mPC + 3;
  return 1;
}

Assistant:

static int mov_mem_mem(struct em8051 *aCPU)
{
    int address1 = OPERAND2;
    int value = read_mem(aCPU, OPERAND1);

    if (address1 > 0x7f)
    {
        aCPU->mSFR[address1 - 0x80] = value;
        if (aCPU->sfrwrite)
            aCPU->sfrwrite(aCPU, address1);
    }
    else
    {
        aCPU->mLowerData[address1] = value;
    }

    PC += 3;
    return 1;
}